

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_operators.cpp
# Opt level: O1

void __thiscall
test_vector_operators_angle_Test::~test_vector_operators_angle_Test
          (test_vector_operators_angle_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_vector_operators, angle) {
  Vector_Dense<Scalar, 0> dynamic_vector_0 = {1.0, 0.0, 0.0};
  Vector_Dense<Scalar, 0> dynamic_vector_1 = {0.0, 1.0, 0.0};
  Vector_Dense<Scalar, 3> static_vector_0 = {1.0, 0.0, 0.0};
  Vector_Dense<Scalar, 3> static_vector_1 = {0.0, 0.0, 1.0};

  Scalar angle_radian = angle<true>(dynamic_vector_0, dynamic_vector_1);
  Scalar angle_degree = angle<false>(dynamic_vector_0, dynamic_vector_1);
  EXPECT_DOUBLE_EQ(angle_radian, 0.5 * std::numbers::pi);
  EXPECT_DOUBLE_EQ(angle_degree, 90.0);

  angle_radian = angle<true>(static_vector_0, static_vector_1);
  angle_degree = angle<false>(static_vector_0, static_vector_1);
  EXPECT_DOUBLE_EQ(angle_radian, 0.5 * std::numbers::pi);
  EXPECT_DOUBLE_EQ(angle_degree, 90.0);

  angle_radian = angle<true>(dynamic_vector_0, static_vector_1);
  angle_degree = angle<false>(static_vector_1, dynamic_vector_1);
  EXPECT_DOUBLE_EQ(angle_radian, 0.5 * std::numbers::pi);
  EXPECT_DOUBLE_EQ(angle_degree, 90.0);

  EXPECT_DEATH((cross_product(Vector_Dense<Scalar, 0>(), Vector_Dense<Scalar, 3>())), "./*");
  EXPECT_DEATH((cross_product(Vector_Dense<Scalar, 4>(), Vector_Dense<Scalar, 4>())), "./*");
}